

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O3

LPVOID VIRTUALCommitMemory(CPalThread *pthrCurrent,LPVOID lpAddress,SIZE_T dwSize,
                          DWORD flAllocationType,DWORD flProtect)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  INT IVar4;
  INT __prot;
  uint __c;
  int iVar5;
  int iVar6;
  BOOL BVar7;
  PCMI pInformation;
  void *pvVar8;
  LPVOID pvVar9;
  int *piVar10;
  char *__format;
  void *__addr;
  UINT_PTR address;
  ulong uVar11;
  ulong Index;
  size_t __len;
  ulong Index_00;
  SIZE_T SVar12;
  SIZE_T nNumberOfBits;
  uint uVar13;
  ulong uVar14;
  uint local_34;
  
  if (lpAddress == (LPVOID)0x0) {
    __len = dwSize + 0xfff & 0xfffffffffffff000;
    address = 0;
  }
  else {
    address = (ulong)lpAddress & 0xfffffffffffff000;
    __len = ((long)lpAddress + dwSize + 0xfff & 0xfffffffffffff000) - address;
  }
  pInformation = VIRTUALFindRegionInformation(address);
  if (pInformation == (PCMI)0x0) {
    pvVar9 = VIRTUALReserveMemory(pthrCurrent,lpAddress,dwSize,flAllocationType,flProtect);
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00130bba;
    if (pvVar9 == (LPVOID)0x0) {
      return (LPVOID)0x0;
    }
    address = (ulong)pvVar9 & 0xfffffffffffff000;
    pInformation = VIRTUALFindRegionInformation(address);
    if (pInformation == (PCMI)0x0) {
      fprintf(_stderr,"] %s %s:%d","VIRTUALCommitMemory",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x4af);
      __format = "Unable to locate the region information.\n";
      goto LAB_00130b96;
    }
    __len = ((long)pvVar9 + dwSize + 0xfff & 0xfffffffffffff000) - address;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    uVar11 = address - pInformation->startBoundary;
    Index_00 = uVar11 >> 0xc;
    IVar4 = VIRTUALGetAllocationType(Index_00,pInformation);
    bVar1 = pInformation->pProtectionState[Index_00];
    __prot = W32toUnixAccessControl(flProtect);
    bVar3 = VIRTUALConvertWinFlags(flProtect);
    if (__len >> 0xc <= (pInformation->memSize >> 0xc) - Index_00) {
      if (0xfff < __len) {
        __c = (uint)bVar3;
        uVar14 = (__len >> 0xc) + Index_00;
        local_34 = (uint)bVar1;
        do {
          Index = Index_00 + 1;
          SVar12 = 1;
          nNumberOfBits = SVar12;
          uVar13 = local_34;
          iVar5 = IVar4;
          if (Index < uVar14) {
            do {
              iVar5 = VIRTUALGetAllocationType(Index,pInformation);
              bVar1 = pInformation->pProtectionState[Index];
              nNumberOfBits = SVar12;
              uVar13 = (uint)bVar1;
              if ((iVar5 != IVar4) || (local_34 != bVar1)) break;
              SVar12 = SVar12 + 1;
              Index = Index + 1;
              nNumberOfBits = uVar14 - Index_00;
              uVar13 = local_34;
              iVar5 = IVar4;
            } while (Index < uVar14);
          }
          __addr = (void *)(Index_00 * 0x1000 + pInformation->startBoundary);
          __len = nNumberOfBits << 0xc;
          if (IVar4 != 0x1000) {
            pvVar8 = mmap64(__addr,__len,3,0x32,-1,0);
            if (pvVar8 != (void *)0xffffffffffffffff) {
              VIRTUALSetAllocState(0x1000,Index_00,nNumberOfBits,pInformation);
              local_34 = 2;
              if (__prot == 3) {
                memset(pInformation->pProtectionState + Index_00,__c,nNumberOfBits);
              }
              goto LAB_00130a03;
            }
LAB_00130ad5:
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_00130bba;
            piVar10 = __errno_location();
            strerror(*piVar10);
            goto LAB_00130af5;
          }
LAB_00130a03:
          if (local_34 != __c) {
            iVar6 = mprotect(__addr,__len,__prot);
            if (iVar6 == -1) goto LAB_00130ad5;
            memset(pInformation->pProtectionState + Index_00,__c,nNumberOfBits);
          }
          Index_00 = Index;
          IVar4 = iVar5;
          local_34 = uVar13;
        } while (Index < uVar14);
      }
      return (LPVOID)((uVar11 & 0xfffffffffffff000) + pInformation->startBoundary);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
LAB_00130af5:
      if (!bVar2 && (flAllocationType & 0x2000) == 0) {
        return (LPVOID)0x0;
      }
      munmap((void *)0x0,__len);
      BVar7 = VIRTUALReleaseMemory(pInformation);
      if (BVar7 != 0) {
        return (LPVOID)0x0;
      }
      fprintf(_stderr,"] %s %s:%d","VIRTUALCommitMemory",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x544);
      __format = "Unable to remove the PCMI entry from the list.\n";
LAB_00130b96:
      fprintf(_stderr,__format);
      piVar10 = __errno_location();
      *piVar10 = 0x54f;
      return (LPVOID)0x0;
    }
  }
LAB_00130bba:
  abort();
}

Assistant:

static LPVOID VIRTUALCommitMemory(
                IN CPalThread *pthrCurrent, /* Currently executing thread */
                IN LPVOID lpAddress,        /* Region to reserve or commit */
                IN SIZE_T dwSize,           /* Size of Region */
                IN DWORD flAllocationType,  /* Type of allocation */
                IN DWORD flProtect)         /* Type of access protection */
{
    UINT_PTR StartBoundary      = 0;
    SIZE_T MemSize              = 0;
    PCMI pInformation           = 0;
    LPVOID pRetVal              = NULL;
    BOOL IsLocallyReserved      = FALSE;
    SIZE_T totalPages;
    INT allocationType, curAllocationType;
    INT protectionState, curProtectionState;
    SIZE_T initialRunStart;
    SIZE_T runStart;
    SIZE_T runLength;
    SIZE_T index;
    INT nProtect;
    INT vProtect;

    if ( lpAddress )
    {
        StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;
        /* Add the sizes, and round down to the nearest page boundary. */
        MemSize = ( ((UINT_PTR)lpAddress + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
                  StartBoundary;
    }
    else
    {
        MemSize = ( dwSize + VIRTUAL_PAGE_MASK ) & ~VIRTUAL_PAGE_MASK;
    }

    /* See if we have already reserved this memory. */
    pInformation = VIRTUALFindRegionInformation( StartBoundary );

    if ( !pInformation )
    {
        /* According to the new MSDN docs, if MEM_COMMIT is specified,
        and the memory is not reserved, you reserve and then commit.
        */
        LPVOID pReservedMemory =
                VIRTUALReserveMemory( pthrCurrent, lpAddress, dwSize,
                                      flAllocationType, flProtect );

        TRACE( "Reserve and commit the memory!\n " );

        if ( pReservedMemory )
        {
            /* Re-align the addresses and try again to find the memory. */
            StartBoundary = (UINT_PTR)pReservedMemory & ~VIRTUAL_PAGE_MASK;
            MemSize = ( ((UINT_PTR)pReservedMemory + dwSize + VIRTUAL_PAGE_MASK)
                        & ~VIRTUAL_PAGE_MASK ) - StartBoundary;

            pInformation = VIRTUALFindRegionInformation( StartBoundary );

            if ( !pInformation )
            {
                ASSERT( "Unable to locate the region information.\n" );
                pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
                pRetVal = NULL;
                goto done;
            }
            IsLocallyReserved = TRUE;
        }
        else
        {
            ERROR( "Unable to reserve the memory.\n" );
            /* Don't set last error here, it will already be set. */
            pRetVal = NULL;
            goto done;
        }
    }

    TRACE( "Committing the memory now..\n");

    // Pages that aren't already committed need to be committed. Pages that
    // are committed don't need to be committed, but they might need to have
    // their permissions changed.
    // To get this right, we find runs of pages with similar states and
    // permissions. If a run is not committed, we commit it and then set
    // its permissions. If a run is committed but has different permissions
    // from what we're trying to set, we set its permissions. Finally,
    // if a run is already committed and has the right permissions,
    // we don't need to do anything to it.

    totalPages = MemSize / VIRTUAL_PAGE_SIZE;
    runStart = (StartBoundary - pInformation->startBoundary) /
                VIRTUAL_PAGE_SIZE;   // Page index
    initialRunStart = runStart;
    allocationType = VIRTUALGetAllocationType(runStart, pInformation);
    protectionState = pInformation->pProtectionState[runStart];
    curAllocationType = allocationType;
    curProtectionState = protectionState;
    runLength = 1;
    nProtect = W32toUnixAccessControl(flProtect);
    vProtect = VIRTUALConvertWinFlags(flProtect);

    if (totalPages > pInformation->memSize / VIRTUAL_PAGE_SIZE - runStart)
    {
        ERROR("Trying to commit beyond the end of the region!\n");
        goto error;
    }

    while(runStart < initialRunStart + totalPages)
    {
        // Find the next run of pages
        for(index = runStart + 1; index < initialRunStart + totalPages;
            index++)
        {
            curAllocationType = VIRTUALGetAllocationType(index, pInformation);
            curProtectionState = pInformation->pProtectionState[index];
            if (curAllocationType != allocationType ||
                curProtectionState != protectionState)
            {
                break;
            }
            runLength++;
        }

        StartBoundary = pInformation->startBoundary + runStart * VIRTUAL_PAGE_SIZE;
        MemSize = runLength * VIRTUAL_PAGE_SIZE;
        if (allocationType != MEM_COMMIT)
        {
            // Commit the pages
            void * pRet = MAP_FAILED;
#if MMAP_DOESNOT_ALLOW_REMAP
            if (mprotect((void *) StartBoundary, MemSize, PROT_WRITE | PROT_READ) == 0)
                pRet = (void *)StartBoundary;
#else // MMAP_DOESNOT_ALLOW_REMAP
            pRet = mmap((void *) StartBoundary, MemSize, PROT_WRITE | PROT_READ,
                     MAP_ANON | MAP_FIXED | MAP_PRIVATE, -1, 0);
#endif // MMAP_DOESNOT_ALLOW_REMAP
            if (pRet != MAP_FAILED)
            {
#if MMAP_DOESNOT_ALLOW_REMAP
                SIZE_T i;
                char *temp = (char *) StartBoundary;
                for(i = 0; i < runLength; i++)
                {

                    if (VIRTUALIsPageDirty(runStart + i, pInformation))
                    {
                        // This page is being recommitted after being decommitted,
                        // therefore the memory needs to be cleared
                        memset (temp, 0, VIRTUAL_PAGE_SIZE);
                    }

                    temp += VIRTUAL_PAGE_SIZE;
                }
#endif // MMAP_DOESNOT_ALLOW_REMAP
            }
            else
            {
                ERROR("mmap() failed! Error(%d)=%s\n", errno, strerror(errno));
                goto error;
            }
            VIRTUALSetAllocState(MEM_COMMIT, runStart, runLength, pInformation);
#if MMAP_DOESNOT_ALLOW_REMAP
            VIRTUALSetDirtyPages (0, runStart, runLength, pInformation);
#endif // MMAP_DOESNOT_ALLOW_REMAP

            if (nProtect == (PROT_WRITE | PROT_READ))
            {
                // Handle this case specially so we don't bother
                // mprotect'ing the region.
                memset(pInformation->pProtectionState + runStart,
                       vProtect, runLength);
            }
            protectionState = VIRTUAL_READWRITE;
        }
        if (protectionState != vProtect)
        {
            // Change permissions.
            if (mprotect((void *) StartBoundary, MemSize, nProtect) != -1)
            {
                memset(pInformation->pProtectionState + runStart,
                       vProtect, runLength);
            }
            else
            {
                ERROR("mprotect() failed! Error(%d)=%s\n",
                      errno, strerror(errno));
                goto error;
            }
        }

        runStart = index;
        runLength = 1;
        allocationType = curAllocationType;
        protectionState = curProtectionState;
    }
    pRetVal = (void *) (pInformation->startBoundary +
                        initialRunStart * VIRTUAL_PAGE_SIZE);
    goto done;

error:
    if ( flAllocationType & MEM_RESERVE || IsLocallyReserved )
    {
#if (MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP)
        mmap(pRetVal, MemSize, PROT_NONE, MAP_FIXED | MAP_PRIVATE,
             gBackingFile, (char *) pRetVal - (char *) gBackingBaseAddress);
#else   // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
        munmap( pRetVal, MemSize );
#endif  // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
        if ( VIRTUALReleaseMemory( pInformation ) == FALSE )
        {
            ASSERT( "Unable to remove the PCMI entry from the list.\n" );
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            pRetVal = NULL;
            goto done;
        }
        pInformation = NULL;
        pRetVal = NULL;
    }

done:

    return pRetVal;
}